

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O3

void __thiscall ncnn::Proposal::Proposal(Proposal *this)

{
  int iVar1;
  int *piVar2;
  Allocator *pAVar3;
  void *pvVar4;
  undefined8 *puVar5;
  
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Proposal_00144f70;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->scales).data = (void *)0x0;
  (this->scales).refcount = (int *)0x0;
  (this->scales).elemsize = 0;
  (this->scales).allocator = (Allocator *)0x0;
  (this->scales).dims = 0;
  (this->scales).w = 0;
  (this->scales).h = 0;
  (this->scales).c = 0;
  (this->scales).cstep = 0;
  (this->anchors).data = (void *)0x0;
  (this->anchors).refcount = (int *)0x0;
  (this->anchors).elemsize = 0;
  (this->anchors).allocator = (Allocator *)0x0;
  (this->anchors).dims = 0;
  (this->anchors).w = 0;
  (this->anchors).h = 0;
  (this->anchors).c = 0;
  (this->anchors).cstep = 0;
  (this->ratios).elemsize = 4;
  (this->ratios).allocator = (Allocator *)0x0;
  (this->ratios).dims = 1;
  (this->ratios).w = 3;
  (this->ratios).h = 1;
  (this->ratios).c = 1;
  (this->ratios).cstep = 3;
  pvVar4 = malloc(0x28);
  puVar5 = (undefined8 *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
  puVar5[-1] = pvVar4;
  (this->ratios).data = puVar5;
  (this->ratios).refcount = (int *)((long)puVar5 + 0xc);
  *(undefined4 *)((long)puVar5 + 0xc) = 1;
  iVar1 = (this->scales).dims;
  *puVar5 = 0x3f8000003f000000;
  *(undefined4 *)(puVar5 + 1) = 0x40000000;
  if ((((iVar1 == 1) && ((this->scales).w == 3)) && ((this->scales).elemsize == 4)) &&
     ((this->scales).allocator == (Allocator *)0x0)) {
    puVar5 = (undefined8 *)(this->scales).data;
  }
  else {
    piVar2 = (this->scales).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar4 = (this->scales).data;
        pAVar3 = (this->scales).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(*(void **)((long)pvVar4 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 8))();
        }
      }
    }
    (this->scales).elemsize = 4;
    (this->scales).allocator = (Allocator *)0x0;
    (this->scales).dims = 1;
    (this->scales).w = 3;
    (this->scales).h = 1;
    (this->scales).c = 1;
    (this->scales).cstep = 3;
    pvVar4 = malloc(0x28);
    puVar5 = (undefined8 *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
    puVar5[-1] = pvVar4;
    (this->scales).data = puVar5;
    (this->scales).refcount = (int *)((long)puVar5 + 0xc);
    *(undefined4 *)((long)puVar5 + 0xc) = 1;
  }
  *puVar5 = 0x4180000041000000;
  *(undefined4 *)(puVar5 + 1) = 0x42000000;
  return;
}

Assistant:

Proposal::Proposal()
{
    one_blob_only = false;
    support_inplace = false;

    // TODO load from param
    ratios.create(3);
    ratios[0] = 0.5f;
    ratios[1] = 1.f;
    ratios[2] = 2.f;

    scales.create(3);
    scales[0] = 8.f;
    scales[1] = 16.f;
    scales[2] = 32.f;
}